

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_dischargevars(FuncState *fs,expdesc *e)

{
  int iVar1;
  OpCode local_1c;
  OpCode op;
  expdesc *e_local;
  FuncState *fs_local;
  
  switch(e->k) {
  case VLOCAL:
    e->k = VNONRELOC;
    break;
  case VUPVAL:
    iVar1 = luaK_codeABC(fs,OP_GETUPVAL,0,(e->u).info,0);
    (e->u).info = iVar1;
    e->k = VRELOCABLE;
    break;
  case VINDEXED:
    freereg(fs,(int)(e->u).ind.idx);
    if ((e->u).ind.vt == '\b') {
      freereg(fs,(uint)(e->u).ind.t);
      local_1c = OP_GETTABLE;
    }
    else {
      local_1c = OP_GETTABUP;
    }
    iVar1 = luaK_codeABC(fs,local_1c,0,(uint)(e->u).ind.t,(int)(e->u).ind.idx);
    (e->u).info = iVar1;
    e->k = VRELOCABLE;
    break;
  default:
    break;
  case VCALL:
  case VVARARG:
    luaK_setoneret(fs,e);
  }
  return;
}

Assistant:

void luaK_dischargevars(FuncState *fs, expdesc *e) {
    switch (e->k) {
        case VLOCAL: {  /* already in a register */
            e->k = VNONRELOC;  /* becomes a non-relocatable value */
            break;
        }
        case VUPVAL: {  /* move value to some (pending) register */
            e->u.info = luaK_codeABC(fs, OP_GETUPVAL, 0, e->u.info, 0);
            e->k = VRELOCABLE;
            break;
        }
        case VINDEXED: {
            OpCode op;
            freereg(fs, e->u.ind.idx);
            if (e->u.ind.vt == VLOCAL) {  /* is 't' in a register? */
                freereg(fs, e->u.ind.t);
                op = OP_GETTABLE;
            } else {
                lua_assert(e->u.ind.vt == VUPVAL);
                op = OP_GETTABUP;  /* 't' is in an upvalue */
            }
            e->u.info = luaK_codeABC(fs, op, 0, e->u.ind.t, e->u.ind.idx);
            e->k = VRELOCABLE;
            break;
        }
        case VVARARG:
        case VCALL: {
            luaK_setoneret(fs, e);
            break;
        }
        default:
            break;  /* there is one value available (somewhere) */
    }
}